

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O1

_Bool pmsav8_mpu_lookup_arm
                (CPUARMState *env,uint32_t address,MMUAccessType access_type,ARMMMUIdx mmu_idx,
                hwaddr *phys_ptr,MemTxAttrs *txattrs,int *prot,_Bool *is_subpage,
                ARMMMUFaultInfo_conflict *fi,uint32_t *mregion)

{
  uint uVar1;
  uc_struct_conflict1 *puVar2;
  long lVar3;
  uint32_t *puVar4;
  uint32_t *puVar5;
  bool bVar6;
  _Bool _Var7;
  _Bool _Var8;
  uint32_t uVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  _Bool is_user;
  uint uVar13;
  int line;
  byte bVar14;
  byte bVar15;
  char *file;
  long lVar16;
  uint uVar17;
  ulong uVar18;
  
  puVar2 = env->uc;
  uVar10 = mmu_idx - ARMMMUIdx_E10_0;
  uVar18 = (ulong)uVar10;
  if (uVar10 < 0x37) {
    is_user = true;
    if ((0x55000000010082U >> (uVar18 & 0x3f) & 1) != 0) goto LAB_00588f3d;
    if ((0xdUL >> (uVar18 & 0x3f) & 1) == 0) goto LAB_00589257;
LAB_00589312:
    file = 
    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/helper.c"
    ;
    line = 0x2386;
LAB_0058930b:
    g_assertion_message_expr(file,line,(char *)0x0);
  }
LAB_00589257:
  is_user = false;
LAB_00588f3d:
  if ((0x37 < uVar10) || ((0xff000000070fffU >> (uVar18 & 0x3f) & 1) == 0)) {
    file = 
    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/internals.h"
    ;
    line = 0x37c;
    goto LAB_0058930b;
  }
  lVar3 = *(long *)(&DAT_00d721c8 + uVar18 * 8);
  uVar1 = puVar2->init_target_page->mask;
  *is_subpage = false;
  *phys_ptr = (ulong)address;
  *prot = 0;
  if (mregion != (uint32_t *)0x0) {
    *mregion = 0xffffffff;
  }
  _Var7 = regime_translation_disabled(env,mmu_idx);
  uVar17 = 0xffffffff;
  _Var8 = true;
  if ((!_Var7) && (((address & 0xfff00000) != 0xe0000000 || ((env->features & 0x200) == 0)))) {
    _Var8 = pmsav7_use_background_region
                      ((ARMCPU *)(env[-10].cp15.c14_pmevcntr + 0x1b),mmu_idx,is_user);
    lVar11 = (long)*(int *)((long)env[1].xregs + 0x1c);
    if (lVar11 < 1) {
      uVar17 = 0xffffffff;
    }
    else {
      uVar12 = uVar1 & address;
      puVar4 = (env->pmsav8).rbar[lVar3];
      puVar5 = (env->pmsav8).rlar[lVar3];
      lVar16 = 0xffffffff;
      do {
        uVar17 = puVar5[lVar11 + -1];
        bVar6 = false;
        if ((uVar17 & 1) != 0) {
          uVar13 = puVar4[lVar11 + -1] & 0xffffffe0;
          uVar17 = uVar17 | 0x1f;
          if ((address < uVar13) || (uVar17 < address)) {
            if ((uVar13 <= uVar17) &&
               (((ulong)uVar12 <= ((ulong)((uVar17 - uVar13) + 1) + (ulong)uVar13) - 1 &&
                ((ulong)uVar13 <= ((ulong)uVar12 - 1) - (long)puVar2->init_target_page->mask)))) {
              *is_subpage = true;
            }
          }
          else {
            if ((uVar12 < uVar13) || (uVar17 < ~uVar1 + uVar12)) {
              *is_subpage = true;
            }
            if ((int)lVar16 == -1) {
              lVar16 = lVar11 + -1;
              bVar6 = false;
              _Var8 = true;
            }
            else {
              fi->type = ARMFault_Permission;
              *(undefined4 *)((long)&fi->s2addr + 4) = 1;
              bVar6 = true;
            }
          }
        }
        uVar17 = (uint)lVar16;
        if (bVar6) {
          return true;
        }
        bVar6 = 1 < lVar11;
        lVar11 = lVar11 + -1;
      } while (bVar6);
    }
  }
  if (_Var8 == false) {
    fi->type = ARMFault_Background;
    return true;
  }
  if (uVar17 == 0xffffffff) {
    if ((env->features & 0x200) == 0) {
      *prot = 3;
      if (0xefffffff < address) {
        uVar9 = regime_el(env,mmu_idx);
        if ((*(byte *)((long)(env->cp15).cptr_el + (ulong)uVar9 * 8 + -0x27) & 0x20) != 0) {
          *(byte *)prot = (byte)*prot | 4;
        }
        goto LAB_005892d2;
      }
      if ((int)address < 0) goto LAB_005892d2;
    }
    else if (((0x3fffffff < address + 0xa0000000) && (0x1fffffff < address)) &&
            (uVar10 = address & 0xe0000000, uVar10 != 0x20000000)) {
      if (((0xdfffffff < address) || (uVar10 == 0xc0000000)) ||
         ((0x3fffffff < (int)address || (uVar10 == 0xa0000000)))) {
        *prot = 3;
      }
      goto LAB_005892d2;
    }
    *prot = 7;
    goto LAB_005892d2;
  }
  uVar1 = (env->pmsav8).rbar[lVar3][uVar17];
  uVar12 = uVar1 >> 1 & 3;
  if (uVar10 < 0x37) {
    if ((0x55000000010082U >> (uVar18 & 0x3f) & 1) == 0) {
      if ((0xdUL >> (uVar18 & 0x3f) & 1) != 0) goto LAB_00589312;
      goto LAB_0058927a;
    }
    bVar15 = 1;
    bVar14 = 1;
    uVar10 = 3;
    switch(uVar12) {
    case 0:
      goto switchD_00589183_caseD_0;
    case 2:
      goto switchD_00589183_caseD_2;
    case 3:
      goto switchD_00589183_caseD_3;
    }
  }
  else {
LAB_0058927a:
    bVar15 = 0;
    bVar14 = 0;
    uVar10 = 3;
    switch(uVar12) {
    case 0:
switchD_00589183_caseD_0:
      uVar10 = (uint)(bVar14 ^ 1) + (uint)(bVar14 ^ 1) * 2;
      break;
    case 2:
switchD_00589183_caseD_2:
      uVar10 = (uint)(bVar15 ^ 1);
      break;
    case 3:
switchD_00589183_caseD_3:
      uVar10 = 1;
    }
  }
  uVar12 = uVar10 + 4;
  if ((uVar1 & 1) != 0) {
    uVar12 = uVar10;
  }
  if ((0xdfffffff < address & (*(byte *)((long)&env->features + 1) & 2) >> 1) != 0) {
    uVar12 = uVar10;
  }
  if (uVar10 == 0) {
    uVar12 = uVar10;
  }
  *prot = uVar12;
  if (mregion != (uint32_t *)0x0) {
    *mregion = uVar17;
  }
LAB_005892d2:
  fi->type = ARMFault_Permission;
  *(undefined4 *)((long)&fi->s2addr + 4) = 1;
  return ((uint)*prot >> (access_type & 0x1f) & 1) == 0;
}

Assistant:

bool pmsav8_mpu_lookup(CPUARMState *env, uint32_t address,
                              MMUAccessType access_type, ARMMMUIdx mmu_idx,
                              hwaddr *phys_ptr, MemTxAttrs *txattrs,
                              int *prot, bool *is_subpage,
                              ARMMMUFaultInfo *fi, uint32_t *mregion)
{
    struct uc_struct *uc = env->uc;
    /* Perform a PMSAv8 MPU lookup (without also doing the SAU check
     * that a full phys-to-virt translation does).
     * mregion is (if not NULL) set to the region number which matched,
     * or -1 if no region number is returned (MPU off, address did not
     * hit a region, address hit in multiple regions).
     * We set is_subpage to true if the region hit doesn't cover the
     * entire TARGET_PAGE the address is within.
     */
    ARMCPU *cpu = env_archcpu(env);
    bool is_user = regime_is_user(env, mmu_idx);
    uint32_t secure = regime_is_secure(env, mmu_idx);
    int n;
    int matchregion = -1;
    bool hit = false;
    uint32_t addr_page_base = address & TARGET_PAGE_MASK;
    uint32_t addr_page_limit = addr_page_base + (TARGET_PAGE_SIZE - 1);

    *is_subpage = false;
    *phys_ptr = address;
    *prot = 0;
    if (mregion) {
        *mregion = -1;
    }

    /* Unlike the ARM ARM pseudocode, we don't need to check whether this
     * was an exception vector read from the vector table (which is always
     * done using the default system address map), because those accesses
     * are done in arm_v7m_load_vector(), which always does a direct
     * read using address_space_ldl(), rather than going via this function.
     */
    if (regime_translation_disabled(env, mmu_idx)) { /* MPU disabled */
        hit = true;
    } else if (m_is_ppb_region(env, address)) {
        hit = true;
    } else {
        if (pmsav7_use_background_region(cpu, mmu_idx, is_user)) {
            hit = true;
        }

        for (n = (int)cpu->pmsav7_dregion - 1; n >= 0; n--) {
            /* region search */
            /* Note that the base address is bits [31:5] from the register
             * with bits [4:0] all zeroes, but the limit address is bits
             * [31:5] from the register with bits [4:0] all ones.
             */
            uint32_t base = env->pmsav8.rbar[secure][n] & ~0x1f;
            uint32_t limit = env->pmsav8.rlar[secure][n] | 0x1f;

            if (!(env->pmsav8.rlar[secure][n] & 0x1)) {
                /* Region disabled */
                continue;
            }

            if (address < base || address > limit) {
                /*
                 * Address not in this region. We must check whether the
                 * region covers addresses in the same page as our address.
                 * In that case we must not report a size that covers the
                 * whole page for a subsequent hit against a different MPU
                 * region or the background region, because it would result in
                 * incorrect TLB hits for subsequent accesses to addresses that
                 * are in this MPU region.
                 */
                if (limit >= base &&
                    ranges_overlap(base, limit - base + 1,
                                   addr_page_base,
                                   TARGET_PAGE_SIZE)) {
                    *is_subpage = true;
                }
                continue;
            }

            if (base > addr_page_base || limit < addr_page_limit) {
                *is_subpage = true;
            }

            if (matchregion != -1) {
                /* Multiple regions match -- always a failure (unlike
                 * PMSAv7 where highest-numbered-region wins)
                 */
                fi->type = ARMFault_Permission;
                fi->level = 1;
                return true;
            }

            matchregion = n;
            hit = true;
        }
    }

    if (!hit) {
        /* background fault */
        fi->type = ARMFault_Background;
        return true;
    }

    if (matchregion == -1) {
        /* hit using the background region */
        get_phys_addr_pmsav7_default(env, mmu_idx, address, prot);
    } else {
        uint32_t ap = extract32(env->pmsav8.rbar[secure][matchregion], 1, 2);
        uint32_t xn = extract32(env->pmsav8.rbar[secure][matchregion], 0, 1);

        if (m_is_system_region(env, address)) {
            /* System space is always execute never */
            xn = 1;
        }

        *prot = simple_ap_to_rw_prot(env, mmu_idx, ap);
        if (*prot && !xn) {
            *prot |= PAGE_EXEC;
        }
        /* We don't need to look the attribute up in the MAIR0/MAIR1
         * registers because that only tells us about cacheability.
         */
        if (mregion) {
            *mregion = matchregion;
        }
    }

    fi->type = ARMFault_Permission;
    fi->level = 1;
    return !(*prot & (1 << access_type));
}